

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigsf.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  _Alloc_hider __nptr;
  int iVar2;
  off_t i;
  long lVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  byte bVar6;
  char *__format;
  char *pcVar7;
  off_t offset;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  uint uVar12;
  bool bVar13;
  size_t sStack_2200;
  allocator local_21ed;
  int local_21ec;
  int *local_21e8;
  ulong local_21e0;
  ulong local_21d8;
  char *local_21d0;
  char *endptr;
  long local_21c0;
  char *local_21b8;
  long local_21b0;
  string bytestr;
  uint8_t exe [268];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2068;
  string hexstring;
  char libname [4096];
  
  if (argc == 1) {
LAB_001055fd:
    usage(*argv);
    return 1;
  }
  iVar9 = 1;
  endptr = (char *)0x0;
  local_21d0 = (char *)0x0;
  local_21b8 = (char *)0x0;
  while( true ) {
    uVar12 = argc - iVar9;
    if ((uVar12 == 0 || argc < iVar9) || (pcVar7 = argv[iVar9], *pcVar7 != '-')) break;
    iVar2 = strcmp(pcVar7,"--help");
    if (iVar2 == 0) goto LAB_001055fd;
    iVar2 = strcmp(pcVar7,"--psfby");
    if ((iVar2 == 0) || (iVar2 = strcmp(pcVar7,"--gsfby"), iVar2 == 0)) {
      if (argc <= iVar9 + 1) {
LAB_001059f8:
        __format = "Error: Too few arguments for \"%s\"\n";
        goto LAB_00105a1f;
      }
      local_21b8 = argv[iVar9 + 1];
    }
    else {
      if ((pcVar7[1] != 'o') || (pcVar7[2] != '\0')) {
        __format = "Error: Unknown option \"%s\"\n";
        goto LAB_00105a1f;
      }
      if (argc <= iVar9 + 1) goto LAB_001059f8;
      local_21d0 = argv[iVar9 + 1];
    }
    iVar9 = iVar9 + 2;
  }
  if (uVar12 - 5 < 0xfffffffe) {
    pcVar7 = "Error: Too few/more arguments\n";
    sStack_2200 = 0x1e;
  }
  else {
    if (local_21d0 == (char *)0x0) {
      local_21d0 = argv[iVar9];
    }
    sprintf(libname,"%s.gsflib");
    lVar3 = strtol(argv[(long)iVar9 + 1],&endptr,0x10);
    if (((*endptr != '\0') ||
        (local_21b0 = lVar3, local_21e8 = __errno_location(), *local_21e8 == 0x22)) ||
       (local_21b0 < 0)) {
      pcVar7 = argv[(long)iVar9 + 1];
LAB_001059ef:
      __format = "Error: Number format error \"%s\"\n";
LAB_00105a1f:
      fprintf(_stderr,__format,pcVar7);
      return 1;
    }
    if (((uint)local_21b0 & 0xfffc0000) == 0x2000000 || ((uint)local_21b0 & 0xfe000000) == 0x8000000
       ) {
      if (uVar12 < 4) {
        local_21c0 = 1;
      }
      else {
        local_21c0 = strtol(argv[(long)iVar9 + 3],&endptr,10);
        if (((*endptr != '\0') || (*local_21e8 == 0x22)) || (local_21c0 < 0)) {
          pcVar7 = argv[(long)iVar9 + 3];
          goto LAB_001059ef;
        }
      }
      memset(exe,0,0x10c);
      pcVar7 = argv[(long)iVar9 + 2];
      if (*pcVar7 == '=') {
        std::__cxx11::string::string((string *)&hexstring,pcVar7 + 1,(allocator *)&bytestr);
        if ((hexstring._M_string_length & 1) == 0) {
          local_21e0 = hexstring._M_string_length >> 1;
          if (hexstring._M_string_length < 0x202) {
            local_21d8 = 0;
            uVar10 = 0;
            bVar11 = false;
            uVar8 = 0;
            local_21ec = 0;
            do {
              bVar13 = local_21e0 == uVar8;
              if (bVar13) break;
              std::__cxx11::string::substr((ulong)&bytestr,(ulong)&hexstring);
              __nptr = bytestr._M_dataplus;
              iVar9 = strcasecmp(bytestr._M_dataplus._M_p,"NN");
              if (iVar9 == 0) {
                bVar1 = true;
                if (uVar10 == 0) {
                  uVar10 = 1;
                  local_21d8 = uVar8;
                }
                else {
                  if (!bVar11) {
                    fwrite("Error: Multiple number field\n",0x1d,1,_stderr);
                    goto LAB_00105922;
                  }
                  uVar10 = uVar10 + 1;
                }
                bVar11 = true;
              }
              else {
                lVar3 = strtol(__nptr._M_p,&endptr,0x10);
                if ((*endptr == '\0') && (*local_21e8 != 0x22)) {
                  exe[uVar8 + 0xc] = (uint8_t)lVar3;
                  bVar1 = true;
                  bVar11 = false;
                }
                else {
                  fprintf(_stderr,"Error: Number format error \"%s\"\n",bytestr._M_dataplus._M_p);
LAB_00105922:
                  bVar1 = false;
                  bVar11 = false;
                  local_21ec = 1;
                }
              }
              std::__cxx11::string::~string((string *)&bytestr);
              uVar8 = uVar8 + 1;
            } while (bVar1);
          }
          else {
            fwrite("Error: Output size error\n",0x19,1,_stderr);
            local_21ec = 1;
            bVar13 = false;
            local_21d8 = 0;
            uVar10 = 0;
          }
        }
        else {
          fwrite("Error: Hex string length error\n",0x1f,1,_stderr);
          local_21ec = 1;
          bVar13 = false;
          local_21d8 = 0;
          uVar10 = 0;
          local_21e0 = 0;
        }
        std::__cxx11::string::~string((string *)&hexstring);
        if (!bVar13) {
          return local_21ec;
        }
      }
      else {
        uVar10 = strtol(pcVar7,&endptr,10);
        if (((*endptr != '\0') || (*local_21e8 == 0x22)) || ((long)uVar10 < 0)) {
          pcVar7 = argv[(long)iVar9 + 2];
          goto LAB_001059ef;
        }
        local_21d8 = 0;
        local_21e0 = uVar10;
      }
      uVar8 = local_21d8;
      if (uVar10 < 5) {
        exe[0] = '\0';
        exe[1] = '\0';
        exe[2] = '\0';
        exe[7] = (uint8_t)((ulong)local_21b0 >> 0x18);
        exe[3] = '\b';
        if (((uint)local_21b0 & 0xb000000) != 0x9000000) {
          exe[3] = exe[7];
        }
        exe[4] = (uint8_t)local_21b0;
        exe[5] = (uint8_t)((ulong)local_21b0 >> 8);
        exe[6] = (uint8_t)((ulong)local_21b0 >> 0x10);
        exe[8] = (uint8_t)local_21e0;
        exe[9] = (uint8_t)(local_21e0 >> 8);
        exe[10] = (uint8_t)(local_21e0 >> 0x10);
        exe[0xb] = (uint8_t)(local_21e0 >> 0x18);
        local_21e0 = CONCAT44(local_21e0._4_4_,(int)local_21e0 + 0xc);
        local_21e8 = (int *)((ulong)local_21e8 & 0xffffffff00000000);
        for (uVar12 = 0; uVar12 != (uint)local_21c0; uVar12 = uVar12 + 1) {
          bytestr._M_string_length._0_4_ = 0;
          bytestr.field_2._M_allocated_capacity = 0;
          bytestr.field_2._8_8_ = &bytestr._M_string_length;
          std::__cxx11::string::string((string *)&hexstring,"_lib",&local_21ed);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&bytestr,&hexstring);
          std::__cxx11::string::assign((char *)pmVar4);
          std::__cxx11::string::~string((string *)&hexstring);
          if ((local_21b8 != (char *)0x0) && (*local_21b8 != '\0')) {
            std::__cxx11::string::string((string *)&hexstring,"gsfby",&local_21ed);
            pmVar4 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&bytestr,&hexstring);
            std::__cxx11::string::assign((char *)pmVar4);
            std::__cxx11::string::~string((string *)&hexstring);
          }
          if ((uint)local_21c0 == 1) {
            sprintf((char *)&hexstring,"%s.minigsf",local_21d0);
          }
          else {
            sprintf((char *)&hexstring,"%s-%04d.minigsf",local_21d0);
          }
          if (-1 < (long)local_21d8) {
            bVar6 = 0;
            for (uVar5 = 0; uVar10 != uVar5; uVar5 = uVar5 + 1) {
              exe[uVar5 + uVar8 + 0xc] = (uint8_t)(uVar12 >> (bVar6 & 0x1f));
              bVar6 = bVar6 + 8;
            }
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_Rb_tree(&local_2068,
                     (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&bytestr);
          bVar13 = exe2gsf((char *)&hexstring,exe,(uint32_t)local_21e0,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_2068);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_2068);
          if (bVar13) {
            printf("Created %s\n",&hexstring);
          }
          else {
            printf("Error: Unable to create %s\n",&hexstring);
            local_21e8 = (int *)CONCAT44(local_21e8._4_4_,(int)local_21e8 + 1);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&bytestr);
        }
        return (uint)((int)local_21e8 != 0);
      }
      pcVar7 = "Error: Output number size error\n";
      sStack_2200 = 0x20;
    }
    else {
      fprintf(_stderr,"Error: Load load_offset 0x%08X is out of range\n");
      pcVar7 = 
      "       Valid ranges are 0x8000000..0x9FFFFFF and 0x2000000..0x203FFFF (for multiboot ROM)\n";
      sStack_2200 = 0x5a;
    }
  }
  fwrite(pcVar7,sStack_2200,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc == 1) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	long longval;
	char *endptr = NULL;

	char *psfby = NULL;

	char *outname = NULL;

	int argi = 1;
	while (argi < argc && argv[argi][0] == '-') {
		if (strcmp(argv[argi], "--help") == 0) {
			usage(argv[0]);
			return EXIT_FAILURE;
		}
		else if (strcmp(argv[argi], "--psfby") == 0 || strcmp(argv[argi], "--gsfby") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			psfby = argv[argi + 1];
			argi++;
		}
		else if (strcmp(argv[argi], "-o") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			outname = argv[argi + 1];
			argi++;
		}
		else {
			fprintf(stderr, "Error: Unknown option \"%s\"\n", argv[argi]);
			return EXIT_FAILURE;
		}
		argi++;
	}

	int argnum = argc - argi;
	if (argnum < 3 || argnum > 4) {
		fprintf(stderr, "Error: Too few/more arguments\n");
		return EXIT_FAILURE;
	}

	char * gsf_basename = argv[argi];
	if (outname == NULL) outname = gsf_basename;

	char libname[PATH_MAX];
	sprintf(libname, "%s.gsflib", gsf_basename);

	longval = strtol(argv[argi + 1], &endptr, 16);
	if (*endptr != '\0' || errno == ERANGE || longval < 0) {
		fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 1]);
		return EXIT_FAILURE;
	}
	uint32_t load_offset = (uint32_t)longval;
	if (!((load_offset >= 0x8000000 && load_offset <= 0x9ffffff) || (load_offset >= 0x2000000 && load_offset <= 0x203ffff))) {
		fprintf(stderr, "Error: Load load_offset 0x%08X is out of range\n", load_offset);
		fprintf(stderr, "       Valid ranges are 0x8000000..0x9FFFFFF and 0x2000000..0x203FFFF (for multiboot ROM)\n");
		return EXIT_FAILURE;
	}

	uint32_t count = 1;
	if (argnum >= 4)
	{
		longval = strtol(argv[argi + 3], &endptr, 10);
		if (*endptr != '\0' || errno == ERANGE || longval < 0) {
			fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 3]);
			return EXIT_FAILURE;
		}
		count = (uint32_t)longval;
	}

	uint8_t exe[GSF_EXE_HEADER_SIZE + 256];
	memset(exe, 0, GSF_EXE_HEADER_SIZE + 256);

	off_t offset_of_num = 0;
	size_t size_of_num = 0;
	size_t romsize = 0;
	if (argv[argi + 2][0] == '=') {
		std::string hexstring(&argv[argi + 2][1]);

		if (hexstring.length() % 2 != 0) {
			fprintf(stderr, "Error: Hex string length error\n");
			return EXIT_FAILURE;
		}
		romsize = hexstring.length() / 2;
		if (romsize > 256) {
			fprintf(stderr, "Error: Output size error\n");
			return EXIT_FAILURE;
		}

		bool in_number = false;
		uint8_t * hex = &exe[GSF_EXE_HEADER_SIZE];
		for (off_t offset = 0; offset < (off_t)romsize; offset++) {
			std::string bytestr = hexstring.substr(offset * 2, 2);

			if (strcasecmp(bytestr.c_str(), "NN") == 0) {
				if (size_of_num == 0) {
					offset_of_num = offset;
					size_of_num = 1;
					in_number = true;
				}
				else {
					if (!in_number) {
						fprintf(stderr, "Error: Multiple number field\n");
						return EXIT_FAILURE;
					}
					size_of_num++;
				}
			}
			else {
				in_number = false;

				longval = strtol(bytestr.c_str(), &endptr, 16);
				if (*endptr != '\0' || errno == ERANGE) {
					fprintf(stderr, "Error: Number format error \"%s\"\n", bytestr.c_str());
					return EXIT_FAILURE;
				}

				hex[offset] = (uint8_t)longval;
			}
		}
	} else {
		longval = strtol(argv[argi + 2], &endptr, 10);
		if (*endptr != '\0' || errno == ERANGE || longval < 0) {
			fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 2]);
			return EXIT_FAILURE;
		}
		romsize = size_of_num = (size_t)longval;
	}

	if (size_of_num > 4) {
		fprintf(stderr, "Error: Output number size error\n");
		return EXIT_FAILURE;
	}

	uint32_t entrypoint = load_offset & 0xFF000000;
	if (entrypoint == 0x9000000)
		entrypoint = 0x8000000;
	writeInt(&exe[0], entrypoint);
	writeInt(&exe[4], load_offset);
	writeInt(&exe[8], (uint32_t)romsize);

	int num_error = 0;
	for (uint32_t num = 0; num < count; num++) {
		std::map<std::string, std::string> tags;
		tags["_lib"] = libname;

		if (psfby != NULL && strcmp(psfby, "") != 0) {
			tags["gsfby"] = psfby;
		}

		char gsf_path[PATH_MAX];
		if (count != 1)
			sprintf(gsf_path, "%s-%04d.minigsf", outname, num);
		else
			sprintf(gsf_path, "%s.minigsf", outname);

		// patch exe
		if (offset_of_num >= 0) {
			for (off_t i = 0; i < (off_t)size_of_num; i++) {
				exe[GSF_EXE_HEADER_SIZE + offset_of_num + i] = (num >> (8 * i)) & 0xff;
			}
		}

		if (exe2gsf(gsf_path, exe, GSF_EXE_HEADER_SIZE + (uint32_t)romsize, tags)) {
			printf("Created %s\n", gsf_path);
		}
		else {
			printf("Error: Unable to create %s\n", gsf_path);
			num_error++;
		}
	}

	return (num_error == 0) ? EXIT_SUCCESS : EXIT_FAILURE;
}